

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

char __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FractionalDigitGenerator::GetOneDigit
          (FractionalDigitGenerator *this)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  long *plVar4;
  pointer puVar5;
  size_t sVar6;
  byte bVar7;
  size_t sVar8;
  FractionalDigitGenerator FStack_60;
  
  sVar8 = this->after_chunk_index_;
  if (sVar8 == 0) {
    uVar3 = 0;
  }
  else {
    puVar5 = (this->data_).ptr_;
    uVar1 = (this->data_).len_;
    uVar3 = 0;
    sVar6 = sVar8;
    do {
      if (uVar1 <= sVar8 - 1) {
        str_format_internal::_GLOBAL__N_1::FractionalDigitGenerator::GetOneDigit();
        FStack_60._0_8_ = *(undefined8 *)puVar5;
        FStack_60.after_chunk_index_ = *(size_t *)(puVar5 + 2);
        FStack_60.data_.ptr_ = *(pointer *)(puVar5 + 4);
        FStack_60.data_.len_ = *(size_type *)(puVar5 + 6);
        plVar4 = *(long **)this;
        if ((plVar4[1] == 0) || (plVar4 = (long *)this->after_chunk_index_, *plVar4 == 0))
        goto LAB_0101f54d;
        bVar7 = FStack_60.next_digit_;
        goto LAB_0101f489;
      }
      uVar3 = uVar3 + (ulong)puVar5[sVar6 - 1] * 10;
      puVar5[sVar6 - 1] = (uint)uVar3;
      sVar6 = sVar6 - 1;
      uVar3 = uVar3 >> 0x20;
    } while (sVar6 != 0);
    if (puVar5[sVar8 - 1] == 0) {
      this->after_chunk_index_ = sVar8 - 1;
    }
  }
  return (char)uVar3;
LAB_0101f489:
  if ((bVar7 == 0) && (FStack_60.after_chunk_index_ == 0)) goto LAB_0101f54d;
  bVar2 = GetOneDigit(&FStack_60);
  FStack_60.next_digit_ = bVar2;
  if (bVar2 == 9) {
    sVar8 = 0;
    do {
      sVar8 = sVar8 + 1;
      bVar2 = GetOneDigit(&FStack_60);
      FStack_60.next_digit_ = bVar2;
    } while (bVar2 == 9);
  }
  else {
    sVar8 = 0;
  }
  uVar3 = sVar8 + 1;
  if (*(ulong *)this->after_chunk_index_ <= uVar3) {
    if ((((*(ulong *)this->after_chunk_index_ < uVar3) || (5 < bVar2)) ||
        (bVar2 == 5 && FStack_60.after_chunk_index_ != 0)) ||
       ((FStack_60.after_chunk_index_ == 0 && bVar2 == 5 &&
        (((int)(char)bVar7 & 0x80000001U) == 1 || sVar8 != 0)))) {
      FormatSinkImpl::Append(*(FormatSinkImpl **)(*(long *)this + 0x18),1,bVar7 + 0x31);
      plVar4 = (long *)this->after_chunk_index_;
      *plVar4 = *plVar4 + -1;
    }
    else {
      FormatSinkImpl::Append(*(FormatSinkImpl **)(*(long *)this + 0x18),1,bVar7 + 0x30);
      FormatSinkImpl::Append
                (*(FormatSinkImpl **)(*(long *)this + 0x18),*(long *)this->after_chunk_index_ - 1,
                 '9');
      plVar4 = (long *)this->after_chunk_index_;
      *plVar4 = 0;
    }
    goto LAB_0101f54d;
  }
  FormatSinkImpl::Append(*(FormatSinkImpl **)(*(long *)this + 0x18),1,bVar7 + 0x30);
  FormatSinkImpl::Append(*(FormatSinkImpl **)(*(long *)this + 0x18),sVar8,'9');
  plVar4 = (long *)this->after_chunk_index_;
  *plVar4 = *plVar4 - uVar3;
  bVar7 = bVar2;
  if (*plVar4 == 0) {
LAB_0101f54d:
    return (char)plVar4;
  }
  goto LAB_0101f489;
}

Assistant:

char GetOneDigit() {
    if (!after_chunk_index_)
      return 0;

    char carry = 0;
    for (size_t i = after_chunk_index_; i > 0; --i) {
      carry = MultiplyBy10WithCarry(&data_[i - 1], carry);
    }
    // If the lowest chunk is now empty, remove it from view.
    if (data_[after_chunk_index_ - 1] == 0)
      --after_chunk_index_;
    return carry;
  }